

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

SampledSpectrum __thiscall
pbrt::ConductorBxDF::f(ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  array<float,_4> aVar1;
  bool bVar2;
  TrowbridgeReitzDistribution *in_RDI;
  Float FVar3;
  ulong extraout_XMM0_Qb;
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_ZMM2 [64];
  Vector3<float> VVar15;
  SampledSpectrum SVar16;
  SampledSpectrum F;
  Float frCosTheta_i;
  Vector3f wh;
  Float cosTheta_i;
  Float cosTheta_o;
  undefined4 in_stack_00000114;
  SampledSpectrum *in_stack_00000118;
  Float in_stack_00000124;
  SampledSpectrum *s;
  Tuple3<pbrt::Vector3,_float> *this_00;
  Vector3<float> *in_stack_fffffffffffffee8;
  SampledSpectrum *this_01;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Vector3<float> *v2;
  Tuple3<pbrt::Vector3,_float> *v;
  undefined1 local_bc [20];
  float local_a8;
  float local_a4;
  Tuple3<pbrt::Vector3,_float> local_a0;
  Tuple3<pbrt::Vector3,_float> local_90;
  Tuple3<pbrt::Vector3,_float> local_80;
  Tuple3<pbrt::Vector3,_float> local_70;
  float local_64;
  Float local_60;
  Tuple3<pbrt::Vector3,_float> local_4c;
  undefined1 local_3c [28];
  Tuple3<pbrt::Vector3,_float> local_20;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar10 [56];
  undefined1 auVar14 [56];
  
  local_3c._12_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_4c._0_8_ = vmovlpd_avx(in_ZMM2._0_16_);
  local_3c._0_8_ = local_4c._0_8_;
  local_20._0_8_ = local_3c._12_8_;
  bVar2 = SameHemisphere((Vector3f *)&local_20,(Vector3f *)local_3c);
  if (bVar2) {
    bVar2 = TrowbridgeReitzDistribution::EffectivelySpecular
                      ((TrowbridgeReitzDistribution *)0x6a1f9c);
    if (bVar2) {
      memset(&local_10,0,0x10);
      SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6a1fc3);
    }
    else {
      v = &local_20;
      local_60 = AbsCosTheta((Vector3f *)0x6a1fda);
      v2 = (Vector3<float> *)local_3c;
      local_64 = AbsCosTheta((Vector3f *)0x6a1ff5);
      auVar10 = extraout_var;
      VVar15 = Tuple3<pbrt::Vector3,float>::operator+
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                          in_stack_fffffffffffffee8);
      local_80.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar4._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar4._8_56_ = auVar10;
      local_80._0_8_ = vmovlpd_avx(auVar4._0_16_);
      local_70._0_8_ = local_80._0_8_;
      local_70.z = local_80.z;
      if (((local_64 == 0.0) && (!NAN(local_64))) || ((local_60 == 0.0 && (!NAN(local_60))))) {
        memset(&local_10,0,0x10);
        SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6a208a);
      }
      else {
        local_70.x = local_80.x;
        if ((local_70.x == 0.0) && (!NAN(local_70.x))) {
          local_70.y = local_80.y;
          if ((local_70.y == 0.0) &&
             (((!NAN(local_70.y) && (local_80.z == 0.0)) && (!NAN(local_80.z))))) {
            memset(&local_10,0,0x10);
            SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6a20ef);
            goto LAB_006a2279;
          }
        }
        auVar10 = (undefined1  [56])0x0;
        this_00 = &local_70;
        VVar15 = Normalize<float>((Vector3<float> *)v);
        local_a0.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar5._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar5._8_56_ = auVar10;
        local_a0._0_8_ = vmovlpd_avx(auVar5._0_16_);
        s = (SampledSpectrum *)local_bc;
        auVar14 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
        auVar10 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
        local_90._0_8_ = local_a0._0_8_;
        local_90.z = local_a0.z;
        local_70._0_8_ = local_a0._0_8_;
        local_70.z = local_a0.z;
        Vector3<float>::Vector3((Vector3<float> *)this_00,(float)((ulong)s >> 0x20),SUB84(s,0),0.0);
        VVar15 = FaceForward<float>((Vector3<float> *)v,v2);
        local_a8 = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar6._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar6._8_56_ = auVar10;
        local_bc._12_8_ = vmovlpd_avx(auVar6._0_16_);
        this_01 = (SampledSpectrum *)local_3c;
        local_a4 = AbsDot<float>((Vector3<float> *)this_00,(Vector3<float> *)s);
        auVar10 = (undefined1  [56])0x0;
        SVar16 = FrConductor(in_stack_00000124,in_stack_00000118,
                             (SampledSpectrum *)
                             CONCAT44(in_stack_00000114,wo.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar11._0_8_ = SVar16.values.values._8_8_;
        auVar11._8_56_ = auVar14;
        auVar7._0_8_ = SVar16.values.values._0_8_;
        auVar7._8_56_ = auVar10;
        vmovlpd_avx(auVar7._0_16_);
        vmovlpd_avx(auVar11._0_16_);
        FVar3 = TrowbridgeReitzDistribution::D(in_RDI,(Vector3f *)v);
        TrowbridgeReitzDistribution::G
                  ((TrowbridgeReitzDistribution *)CONCAT44(FVar3,in_stack_fffffffffffffef0),
                   (Vector3f *)this_01,(Vector3f *)this_00);
        auVar14 = ZEXT856(extraout_XMM0_Qb);
        auVar10 = (undefined1  [56])0x0;
        FVar3 = (Float)((ulong)this_00 >> 0x20);
        SVar16 = pbrt::operator*(FVar3,s);
        auVar12._0_8_ = SVar16.values.values._8_8_;
        auVar12._8_56_ = auVar14;
        auVar8._0_8_ = SVar16.values.values._0_8_;
        auVar8._8_56_ = auVar10;
        vmovlpd_avx(auVar8._0_16_);
        vmovlpd_avx(auVar12._0_16_);
        auVar14 = (undefined1  [56])0x0;
        auVar10 = (undefined1  [56])0x0;
        SVar16 = SampledSpectrum::operator/(this_01,FVar3);
        auVar13._0_8_ = SVar16.values.values._8_8_;
        auVar13._8_56_ = auVar14;
        auVar9._0_8_ = SVar16.values.values._0_8_;
        auVar9._8_56_ = auVar10;
        local_10 = vmovlpd_avx(auVar9._0_16_);
        local_8 = vmovlpd_avx(auVar13._0_16_);
      }
    }
  }
  else {
    memset(&local_10,0,0x10);
    SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x6a1f8d);
  }
LAB_006a2279:
  aVar1.values[2] = (float)(undefined4)local_8;
  aVar1.values[3] = (float)local_8._4_4_;
  aVar1.values[0] = (float)(undefined4)local_10;
  aVar1.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar1.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return {};
        if (mfDistrib.EffectivelySpecular())
            return {};
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return {};

        wh = Normalize(wh);
        Float frCosTheta_i = AbsDot(wi, FaceForward(wh, Vector3f(0, 0, 1)));
        SampledSpectrum F = FrConductor(frCosTheta_i, eta, k);
        return mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F / (4 * cosTheta_i * cosTheta_o);
    }